

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QRectF>::emplace<QRectF_const&>
          (QMovableArrayOps<QRectF> *this,qsizetype i,QRectF *args)

{
  QRectF **ppQVar1;
  QRectF *pQVar2;
  Data *pDVar3;
  QRectF *pQVar4;
  qreal qVar5;
  qreal qVar6;
  qreal qVar7;
  qreal qVar8;
  qsizetype *pqVar9;
  bool bVar10;
  
  pDVar3 = (this->super_QGenericArrayOps<QRectF>).super_QArrayDataPointer<QRectF>.d;
  if ((pDVar3 != (Data *)0x0) &&
     ((__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if (((this->super_QGenericArrayOps<QRectF>).super_QArrayDataPointer<QRectF>.size == i) &&
       (pQVar4 = (this->super_QGenericArrayOps<QRectF>).super_QArrayDataPointer<QRectF>.ptr,
       (pDVar3->super_QArrayData).alloc !=
       ((long)((long)pQVar4 -
              ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 5) +
       i)) {
      qVar5 = args->xp;
      qVar6 = args->yp;
      qVar7 = args->h;
      pQVar4[i].w = args->w;
      (&pQVar4[i].w)[1] = qVar7;
      pQVar4[i].xp = qVar5;
      pQVar4[i].yp = qVar6;
      goto LAB_005f31c8;
    }
    if ((i == 0) &&
       (pQVar4 = (this->super_QGenericArrayOps<QRectF>).super_QArrayDataPointer<QRectF>.ptr,
       (QRectF *)((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) !=
       pQVar4)) {
      qVar5 = args->xp;
      qVar6 = args->yp;
      qVar7 = args->h;
      pQVar4[-1].w = args->w;
      pQVar4[-1].h = qVar7;
      pQVar4[-1].xp = qVar5;
      pQVar4[-1].yp = qVar6;
      ppQVar1 = &(this->super_QGenericArrayOps<QRectF>).super_QArrayDataPointer<QRectF>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
      goto LAB_005f31c8;
    }
  }
  qVar5 = args->xp;
  qVar6 = args->yp;
  qVar7 = args->w;
  qVar8 = args->h;
  bVar10 = (this->super_QGenericArrayOps<QRectF>).super_QArrayDataPointer<QRectF>.size != 0;
  QArrayDataPointer<QRectF>::detachAndGrow
            ((QArrayDataPointer<QRectF> *)this,(uint)(i == 0 && bVar10),1,(QRectF **)0x0,
             (QArrayDataPointer<QRectF> *)0x0);
  pQVar4 = (this->super_QGenericArrayOps<QRectF>).super_QArrayDataPointer<QRectF>.ptr;
  if (i == 0 && bVar10) {
    pQVar4[-1].xp = qVar5;
    pQVar4[-1].yp = qVar6;
    pQVar4[-1].w = qVar7;
    pQVar4[-1].h = qVar8;
    (this->super_QGenericArrayOps<QRectF>).super_QArrayDataPointer<QRectF>.ptr = pQVar4 + -1;
  }
  else {
    pQVar2 = pQVar4 + i;
    memmove(pQVar2 + 1,pQVar4 + i,
            ((this->super_QGenericArrayOps<QRectF>).super_QArrayDataPointer<QRectF>.size - i) * 0x20
           );
    pQVar2->xp = qVar5;
    pQVar2->yp = qVar6;
    pQVar2->w = qVar7;
    pQVar2->h = qVar8;
  }
LAB_005f31c8:
  pqVar9 = &(this->super_QGenericArrayOps<QRectF>).super_QArrayDataPointer<QRectF>.size;
  *pqVar9 = *pqVar9 + 1;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }